

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interface.cc
# Opt level: O3

int rlbot::Interface::SendQuickChat(QuickChatSelection message,int botIndex,bool teamOnly)

{
  code *pcVar1;
  int iVar2;
  uint8_t *puVar3;
  uoffset_t uVar4;
  FlatBufferBuilder builder;
  FlatBufferBuilder local_88;
  
  local_88.buf_.allocator_ = &flatbuffers::DefaultAllocator::instance()->super_Allocator;
  local_88.buf_.own_allocator_ = false;
  local_88.buf_.initial_size_ = 0x32;
  local_88.buf_.buffer_minalign_ = 8;
  local_88.buf_.reserved_ = 0;
  local_88.buf_.buf_ = (uint8_t *)0x0;
  local_88.buf_.cur_ = (uint8_t *)0x0;
  local_88.buf_.scratch_ = (uint8_t *)0x0;
  local_88.num_field_loc = 0;
  local_88.max_voffset_ = 0;
  local_88.nested = false;
  local_88.finished = false;
  local_88.minalign_ = 1;
  local_88.force_defaults_ = false;
  local_88.dedup_vtables_ = true;
  local_88.string_pool = (StringOffsetMap *)0x0;
  flatbuffers::FlatBufferBuilder::NotNested(&local_88);
  local_88.nested = true;
  uVar4 = ((int)local_88.buf_.reserved_ - (int)local_88.buf_.cur_) + (int)local_88.buf_.buf_;
  flatbuffers::FlatBufferBuilder::AddElement<float>(&local_88,0xc,0.0,0.0);
  flatbuffers::FlatBufferBuilder::AddElement<int>(&local_88,10,0,0);
  flatbuffers::FlatBufferBuilder::AddElement<int>(&local_88,6,botIndex,0);
  flatbuffers::FlatBufferBuilder::AddElement<unsigned_char>(&local_88,8,teamOnly,'\0');
  flatbuffers::FlatBufferBuilder::AddElement<signed_char>(&local_88,4,(char)message,'\0');
  uVar4 = flatbuffers::FlatBufferBuilder::EndTable(&local_88,uVar4);
  flatbuffers::FlatBufferBuilder::Finish(&local_88,uVar4,(char *)0x0,false);
  pcVar1 = _sendQuickChat;
  puVar3 = flatbuffers::FlatBufferBuilder::GetBufferPointer(&local_88);
  iVar2 = (*pcVar1)(puVar3,((int)local_88.buf_.reserved_ - (int)local_88.buf_.cur_) +
                           (int)local_88.buf_.buf_);
  flatbuffers::FlatBufferBuilder::~FlatBufferBuilder(&local_88);
  return iVar2;
}

Assistant:

int Interface::SendQuickChat(rlbot::flat::QuickChatSelection message,
                             int botIndex, bool teamOnly) {
  flatbuffers::FlatBufferBuilder builder(50);

  auto quickChatOffset =
      rlbot::flat::CreateQuickChat(builder, message, botIndex, teamOnly);
  builder.Finish(quickChatOffset);

  return _sendQuickChat(builder.GetBufferPointer(), builder.GetSize());
}